

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtree.cpp
# Opt level: O1

size_t __thiscall
libDAI::JTree::findEfficientTree(JTree *this,VarSet *ns,DEdgeVec *Tree,size_t PreviousRoot)

{
  iterator iVar1;
  vector<libDAI::DEdge,std::allocator<libDAI::DEdge>> *this_00;
  _Base_ptr p_Var2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  size_t sVar5;
  const_iterator cVar6;
  __normal_iterator<libDAI::DEdge_*,_std::vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>_>
  _Var7;
  long lVar8;
  size_t *psVar9;
  pointer pDVar10;
  _Base_ptr p_Var11;
  size_t sVar12;
  pointer __val;
  long lVar13;
  long lVar14;
  long lVar15;
  DEdgeVec newTree;
  VarSet nsrem;
  set<libDAI::DEdge,_std::less<libDAI::DEdge>,_std::allocator<libDAI::DEdge>_> subTree;
  Graph oldTree;
  DEdgeVec local_e8;
  VarSet *local_d0;
  size_t local_c8;
  vector<libDAI::DEdge,std::allocator<libDAI::DEdge>> *local_c0;
  VarSet local_b8;
  _Rb_tree<libDAI::DEdge,_libDAI::DEdge,_std::_Identity<libDAI::DEdge>,_std::less<libDAI::DEdge>,_std::allocator<libDAI::DEdge>_>
  local_98;
  _Rb_tree<libDAI::UEdge,_libDAI::UEdge,_std::_Identity<libDAI::UEdge>,_std::less<libDAI::UEdge>,_std::allocator<libDAI::UEdge>_>
  local_60;
  
  local_d0 = ns;
  local_c8 = PreviousRoot;
  local_c0 = (vector<libDAI::DEdge,std::allocator<libDAI::DEdge>> *)Tree;
  iVar4 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])();
  if (*(long *)(CONCAT44(extraout_var,iVar4) + 0xe8) ==
      *(long *)(CONCAT44(extraout_var,iVar4) + 0xe0)) {
    sVar5 = 0;
  }
  else {
    lVar13 = 0;
    p_Var11 = (_Base_ptr)0x0;
    sVar5 = 0;
    sVar12 = 0;
    do {
      iVar4 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])(this);
      VarSet::operator&((VarSet *)&local_60,local_d0,
                        (VarSet *)(*(long *)(CONCAT44(extraout_var_00,iVar4) + 0xe0) + lVar13));
      p_Var2 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
      if ((pointer)local_60._M_impl._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_60._M_impl._0_8_,
                        (long)local_60._M_impl.super__Rb_tree_header._M_header._M_parent -
                        local_60._M_impl._0_8_);
      }
      if (p_Var11 < p_Var2) {
        p_Var11 = p_Var2;
        sVar5 = sVar12;
      }
      sVar12 = sVar12 + 1;
      iVar4 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])(this);
      lVar13 = lVar13 + 0x40;
    } while (sVar12 < (ulong)(*(long *)(CONCAT44(extraout_var_01,iVar4) + 0xe8) -
                              *(long *)(CONCAT44(extraout_var_01,iVar4) + 0xe0) >> 6));
  }
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  pDVar10 = (this->_RTree).super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>._M_impl
            .super__Vector_impl_data._M_start;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if (pDVar10 !=
      (this->_RTree).super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      local_98._M_impl._0_8_ = pDVar10->n1;
      local_98._M_impl.super__Rb_tree_header._M_header._0_8_ = pDVar10->n2;
      std::
      _Rb_tree<libDAI::UEdge,_libDAI::UEdge,_std::_Identity<libDAI::UEdge>,_std::less<libDAI::UEdge>,_std::allocator<libDAI::UEdge>_>
      ::_M_insert_unique<libDAI::UEdge>(&local_60,(UEdge *)&local_98);
      pDVar10 = pDVar10 + 1;
    } while (pDVar10 !=
             (this->_RTree).super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  }
  GrowRootedTree(&local_e8,(Graph *)&local_60,sVar5);
  iVar4 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])(this);
  VarSet::operator/(&local_b8,local_d0,
                    (VarSet *)(sVar5 * 0x40 + *(long *)(CONCAT44(extraout_var_02,iVar4) + 0xe0)));
  local_98._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_98._M_impl.super__Rb_tree_header._M_header;
  local_98._M_impl.super__Rb_tree_header._M_header._0_8_ =
       local_98._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
  local_98._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_98._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_98._M_impl.super__Rb_tree_header._M_header._M_right =
       local_98._M_impl.super__Rb_tree_header._M_header._M_left;
  if (local_b8._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_b8._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    __val = local_b8._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
            super__Vector_impl_data._M_start;
    do {
      if (local_e8.super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_e8.super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>._M_impl.
          super__Vector_impl_data._M_start) {
        lVar13 = 0;
      }
      else {
        lVar14 = 8;
        lVar13 = 0;
        do {
          iVar4 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])
                            (this);
          lVar15 = *(long *)(CONCAT44(extraout_var_03,iVar4) + 0xe0);
          lVar8 = *(long *)((long)&(local_e8.
                                    super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->n1 + lVar14) * 0x40;
          bVar3 = std::
                  binary_search<__gnu_cxx::__normal_iterator<libDAI::Var_const*,std::vector<libDAI::Var,std::allocator<libDAI::Var>>>,libDAI::Var>
                            (*(Var **)(lVar15 + lVar8),*(Var **)(lVar15 + 8 + lVar8),__val);
          if (bVar3) break;
          lVar13 = lVar13 + 1;
          lVar14 = lVar14 + 0x10;
        } while (lVar13 != (long)local_e8.
                                 super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                           (long)local_e8.
                                 super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>.
                                 _M_impl.super__Vector_impl_data._M_start >> 4);
      }
      std::
      _Rb_tree<libDAI::DEdge,libDAI::DEdge,std::_Identity<libDAI::DEdge>,std::less<libDAI::DEdge>,std::allocator<libDAI::DEdge>>
      ::_M_insert_unique<libDAI::DEdge_const&>
                ((_Rb_tree<libDAI::DEdge,libDAI::DEdge,std::_Identity<libDAI::DEdge>,std::less<libDAI::DEdge>,std::allocator<libDAI::DEdge>>
                  *)&local_98,
                 local_e8.super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>._M_impl.
                 super__Vector_impl_data._M_start + lVar13);
      if (lVar13 != 0) {
        sVar12 = local_e8.super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar13].n1;
        lVar14 = lVar13 * 0x10;
        do {
          if (*(size_t *)
               ((long)&local_e8.super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>.
                       _M_impl.super__Vector_impl_data._M_start[-1].n2 + lVar14) == sVar12) {
            std::
            _Rb_tree<libDAI::DEdge,libDAI::DEdge,std::_Identity<libDAI::DEdge>,std::less<libDAI::DEdge>,std::allocator<libDAI::DEdge>>
            ::_M_insert_unique<libDAI::DEdge_const&>
                      ((_Rb_tree<libDAI::DEdge,libDAI::DEdge,std::_Identity<libDAI::DEdge>,std::less<libDAI::DEdge>,std::allocator<libDAI::DEdge>>
                        *)&local_98,
                       (DEdge *)((long)&local_e8.
                                        super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>
                                        ._M_impl.super__Vector_impl_data._M_start[-1].n1 + lVar14));
            sVar12 = *(size_t *)
                      ((long)&local_e8.
                              super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>.
                              _M_impl.super__Vector_impl_data._M_start[-1].n1 + lVar14);
          }
          lVar13 = lVar13 + -1;
          lVar14 = lVar14 + -0x10;
        } while (lVar13 != 0);
      }
      __val = __val + 1;
    } while (__val != local_b8._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                      _M_impl.super__Vector_impl_data._M_finish);
  }
  this_00 = local_c0;
  if ((local_c8 != 0xffffffffffffffff) && (sVar5 != local_c8)) {
    if ((long)local_e8.super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)local_e8.super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>._M_impl.
              super__Vector_impl_data._M_start == 0) {
      lVar13 = 0;
    }
    else {
      lVar14 = (long)local_e8.super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)local_e8.super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 4;
      psVar9 = &(local_e8.super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>._M_impl.
                 super__Vector_impl_data._M_start)->n2;
      lVar15 = 0;
      do {
        lVar13 = lVar15;
        if (*psVar9 == local_c8) break;
        lVar15 = lVar15 + 1;
        psVar9 = psVar9 + 2;
        lVar13 = lVar14;
      } while (lVar14 != lVar15);
    }
    std::
    _Rb_tree<libDAI::DEdge,libDAI::DEdge,std::_Identity<libDAI::DEdge>,std::less<libDAI::DEdge>,std::allocator<libDAI::DEdge>>
    ::_M_insert_unique<libDAI::DEdge_const&>
              ((_Rb_tree<libDAI::DEdge,libDAI::DEdge,std::_Identity<libDAI::DEdge>,std::less<libDAI::DEdge>,std::allocator<libDAI::DEdge>>
                *)&local_98,
               local_e8.super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>._M_impl.
               super__Vector_impl_data._M_start + lVar13);
    if (lVar13 != 0) {
      sVar5 = local_e8.super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>._M_impl.
              super__Vector_impl_data._M_start[lVar13].n1;
      lVar14 = lVar13 * 0x10;
      do {
        if (*(size_t *)
             ((long)&local_e8.super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>.
                     _M_impl.super__Vector_impl_data._M_start[-1].n2 + lVar14) == sVar5) {
          std::
          _Rb_tree<libDAI::DEdge,libDAI::DEdge,std::_Identity<libDAI::DEdge>,std::less<libDAI::DEdge>,std::allocator<libDAI::DEdge>>
          ::_M_insert_unique<libDAI::DEdge_const&>
                    ((_Rb_tree<libDAI::DEdge,libDAI::DEdge,std::_Identity<libDAI::DEdge>,std::less<libDAI::DEdge>,std::allocator<libDAI::DEdge>>
                      *)&local_98,
                     (DEdge *)((long)&local_e8.
                                      super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>
                                      ._M_impl.super__Vector_impl_data._M_start[-1].n1 + lVar14));
          sVar5 = *(size_t *)
                   ((long)&local_e8.
                           super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>._M_impl
                           .super__Vector_impl_data._M_start[-1].n1 + lVar14);
        }
        lVar13 = lVar13 + -1;
        lVar14 = lVar14 + -0x10;
      } while (lVar13 != 0);
    }
  }
  if (*(long *)(this_00 + 8) != *(long *)this_00) {
    *(long *)(this_00 + 8) = *(long *)this_00;
  }
  if (local_e8.super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_e8.super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pDVar10 = local_e8.super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      cVar6 = std::
              _Rb_tree<libDAI::DEdge,_libDAI::DEdge,_std::_Identity<libDAI::DEdge>,_std::less<libDAI::DEdge>,_std::allocator<libDAI::DEdge>_>
              ::find(&local_98,pDVar10);
      if ((_Rb_tree_header *)cVar6._M_node != &local_98._M_impl.super__Rb_tree_header) {
        iVar1._M_current = *(DEdge **)(this_00 + 8);
        if (iVar1._M_current == *(DEdge **)(this_00 + 0x10)) {
          std::vector<libDAI::DEdge,std::allocator<libDAI::DEdge>>::
          _M_realloc_insert<libDAI::DEdge_const&>(this_00,iVar1,pDVar10);
        }
        else {
          sVar5 = pDVar10->n2;
          (iVar1._M_current)->n1 = pDVar10->n1;
          (iVar1._M_current)->n2 = sVar5;
          *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 0x10;
        }
      }
      pDVar10 = pDVar10 + 1;
    } while (pDVar10 !=
             local_e8.super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  lVar13 = *(long *)this_00;
  lVar14 = *(long *)(this_00 + 8);
  for (pDVar10 = local_e8.super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>._M_impl.
                 super__Vector_impl_data._M_start;
      pDVar10 !=
      local_e8.super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>._M_impl.
      super__Vector_impl_data._M_finish; pDVar10 = pDVar10 + 1) {
    _Var7 = std::
            __find_if<__gnu_cxx::__normal_iterator<libDAI::DEdge*,std::vector<libDAI::DEdge,std::allocator<libDAI::DEdge>>>,__gnu_cxx::__ops::_Iter_equals_val<libDAI::DEdge_const>>
                      (*(undefined8 *)this_00,*(undefined8 *)(this_00 + 8),pDVar10);
    iVar1._M_current = *(DEdge **)(this_00 + 8);
    if (_Var7._M_current == iVar1._M_current) {
      if (iVar1._M_current == *(DEdge **)(this_00 + 0x10)) {
        std::vector<libDAI::DEdge,std::allocator<libDAI::DEdge>>::
        _M_realloc_insert<libDAI::DEdge_const&>(this_00,iVar1,pDVar10);
      }
      else {
        sVar5 = pDVar10->n2;
        (iVar1._M_current)->n1 = pDVar10->n1;
        (iVar1._M_current)->n2 = sVar5;
        *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 0x10;
      }
    }
  }
  std::
  _Rb_tree<libDAI::DEdge,_libDAI::DEdge,_std::_Identity<libDAI::DEdge>,_std::less<libDAI::DEdge>,_std::allocator<libDAI::DEdge>_>
  ::~_Rb_tree(&local_98);
  if (local_b8._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
      super__Vector_impl_data._M_start != (Var *)0x0) {
    operator_delete(local_b8._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_b8._vars.
                          super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_b8._vars.
                          super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_e8.super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>._M_impl.
      super__Vector_impl_data._M_start != (key_type *)0x0) {
    operator_delete(local_e8.super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_e8.super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_e8.super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<libDAI::UEdge,_libDAI::UEdge,_std::_Identity<libDAI::UEdge>,_std::less<libDAI::UEdge>,_std::allocator<libDAI::UEdge>_>
  ::~_Rb_tree(&local_60);
  return lVar14 - lVar13 >> 4;
}

Assistant:

size_t JTree::findEfficientTree( const VarSet& ns, DEdgeVec &Tree, size_t PreviousRoot ) const {
        // find new root clique (the one with maximal statespace overlap with ns)
        size_t maxval = 0, maxalpha = 0;
        for( size_t alpha = 0; alpha < grm().nr_ORs(); alpha++ ) {
            size_t val = (ns & grm().OR(alpha).vars()).stateSpace();
            if( val > maxval ) {
                maxval = val;
                maxalpha = alpha;
            }
        }

    //  for( size_t e = 0; e < _RTree.size(); e++ )
    //      cout << grm().OR(_RTree[e].n1).vars() << "->" << grm().OR(_RTree[e].n2).vars() << ",  ";
    //  cout << endl;
        // grow new tree
        Graph oldTree;
        for( DEdgeVec::const_iterator e = _RTree.begin(); e != _RTree.end(); e++ )
            oldTree.insert( UEdge(e->n1, e->n2) );
        DEdgeVec newTree = GrowRootedTree( oldTree, maxalpha );
    //  cout << ns << ": ";
    //  for( size_t e = 0; e < newTree.size(); e++ )
    //      cout << grm().OR(newTree[e].n1).vars() << "->" << grm().OR(newTree[e].n2).vars() << ",  ";
    //  cout << endl;
        
        // identify subtree that contains variables of ns which are not in the new root
        VarSet nsrem = ns / grm().OR(maxalpha).vars();
    //  cout << "nsrem:" << nsrem << endl;
        set<DEdge> subTree;
        // for each variable in ns that is not in the root clique
        for( VarSet::const_iterator n = nsrem.begin(); n != nsrem.end(); n++ ) {
            // find first occurence of *n in the tree, which is closest to the root
            size_t e = 0;
            for( ; e != newTree.size(); e++ ) {
                if( grm().OR(newTree[e].n2).vars() && *n )
                    break;
            }
            assert( e != newTree.size() );

            // track-back path to root and add edges to subTree
            subTree.insert( newTree[e] );
            size_t pos = newTree[e].n1;
            for( ; e > 0; e-- )
                if( newTree[e-1].n2 == pos ) {
                    subTree.insert( newTree[e-1] );
                    pos = newTree[e-1].n1;
                }
        }
        if( PreviousRoot != (size_t)-1 && PreviousRoot != maxalpha) {
            // find first occurence of PreviousRoot in the tree, which is closest to the new root
            size_t e = 0;
            for( ; e != newTree.size(); e++ ) {
                if( newTree[e].n2 == PreviousRoot )
                    break;
            }
            assert( e != newTree.size() );

            // track-back path to root and add edges to subTree
            subTree.insert( newTree[e] );
            size_t pos = newTree[e].n1;
            for( ; e > 0; e-- )
                if( newTree[e-1].n2 == pos ) {
                    subTree.insert( newTree[e-1] );
                    pos = newTree[e-1].n1;
                }
        }
    //  cout << "subTree: " << endl;
    //  for( set<DEdge>::const_iterator sTi = subTree.begin(); sTi != subTree.end(); sTi++ )
    //      cout << grm().OR(sTi->n1).vars() << "->" << grm().OR(sTi->n2).vars() << ",  ";
    //  cout << endl;

        // Resulting Tree is a reordered copy of newTree
        // First add edges in subTree to Tree
        Tree.clear();
        for( DEdgeVec::const_iterator e = newTree.begin(); e != newTree.end(); e++ )
            if( subTree.count( *e ) ) {
                Tree.push_back( *e );
    //          cout << grm().OR(e->n1).vars() << "->" << grm().OR(e->n2).vars() << ",  ";
            }
    //  cout << endl;
        // Then add edges pointing away from nsrem
        // FIXME
    /*  for( DEdgeVec::const_iterator e = newTree.begin(); e != newTree.end(); e++ )
            for( set<DEdge>::const_iterator sTi = subTree.begin(); sTi != subTree.end(); sTi++ )
                if( *e != *sTi ) {
                    if( e->n1 == sTi->n1 || e->n1 == sTi->n2 ||
                        e->n2 == sTi->n1 || e->n2 == sTi->n2 ) {
                        Tree.push_back( *e );
    //                  cout << grm().OR(e->n1).vars() << "->" << grm().OR(e->n2).vars() << ",  ";
                    }
                }*/
        // FIXME
    /*  for( DEdgeVec::const_iterator e = newTree.begin(); e != newTree.end(); e++ )
            if( find( Tree.begin(), Tree.end(), *e) == Tree.end() ) {
                bool found = false;
                for( VarSet::const_iterator n = nsrem.begin(); n != nsrem.end(); n++ )
                    if( (grm().OR(e->n1).vars() && *n) ) {
                        found = true;
                        break;
                    }
                if( found ) {
                    Tree.push_back( *e );
                    cout << grm().OR(e->n1).vars() << "->" << grm().OR(e->n2).vars() << ",  ";
                }
            }
        cout << endl;*/
        size_t subTreeSize = Tree.size();
        // Then add remaining edges
        for( DEdgeVec::const_iterator e = newTree.begin(); e != newTree.end(); e++ )
            if( find( Tree.begin(), Tree.end(), *e ) == Tree.end() )
                Tree.push_back( *e );

        return subTreeSize;
    }